

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.hpp
# Opt level: O1

void __thiscall libtorrent::aux::tracker_request::~tracker_request(tracker_request *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer paVar3;
  pointer paVar4;
  pointer pcVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  p_Var2 = (this->outgoing_socket).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  paVar3 = (this->ipv4).
           super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->ipv4).
                                 super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar4 = (this->ipv6).
           super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar4 != (pointer)0x0) {
    operator_delete(paVar4,(long)(this->ipv6).
                                 super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar4);
  }
  p_Var2 = (this->filter).
           super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pcVar5 = (this->trackerid)._M_dataplus._M_p;
  paVar7 = &(this->trackerid).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar7) {
    operator_delete(pcVar5,paVar7->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->url)._M_dataplus._M_p;
  paVar7 = &(this->url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar7) {
    operator_delete(pcVar5,paVar7->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT tracker_request
	{
		tracker_request() = default;

		static inline constexpr tracker_request_flags_t scrape_request = 0_bit;

		// affects interpretation of peers string in HTTP response
		// see parse_tracker_response()
		static inline constexpr tracker_request_flags_t i2p = 1_bit;

		std::string url;
		std::string trackerid;
#if TORRENT_ABI_VERSION == 1
		std::string auth;
#endif

		std::shared_ptr<const ip_filter> filter;

		std::int64_t downloaded = -1;
		std::int64_t uploaded = -1;
		std::int64_t left = -1;
		std::int64_t corrupt = 0;
		std::int64_t redundant = 0;
		std::uint16_t listen_port = 0;
		event_t event = event_t::none;
		tracker_request_flags_t kind = {};

		std::uint32_t key = 0;
		int num_want = 0;
		std::vector<address_v6> ipv6;
		std::vector<address_v4> ipv4;
		sha1_hash info_hash;
		peer_id pid;

		aux::listen_socket_handle outgoing_socket;

		// set to true if the .torrent file this tracker announce is for is marked
		// as private (i.e. has the "priv": 1 key)
		bool private_torrent = false;

		// this is set to true if this request was triggered by a "manual" call to
		// scrape_tracker() or force_reannounce()
		bool triggered_manually = false;

#if TORRENT_USE_SSL
		ssl::context* ssl_ctx = nullptr;
#endif
#if TORRENT_USE_I2P
		i2p_connection* i2pconn = nullptr;
#endif
#if TORRENT_USE_RTC
		std::vector<aux::rtc_offer> offers;
#endif
	}